

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Body.h
# Opt level: O1

void __thiscall
RigidBodyDynamics::Body::Separate(Body *this,SpatialTransform *transform,Body *other_body)

{
  double dVar1;
  double mass;
  double dVar2;
  double dVar3;
  undefined8 uVar4;
  long lVar5;
  RBDLError *this_00;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  Matrix3d inertia_other_com_rotated_this_origin;
  Vector3d other_com;
  Matrix3d new_inertia;
  Matrix3d inertia_substracted;
  SpatialRigidBodyInertia this_rbi;
  string local_348;
  Matrix3d local_328;
  double local_2d8 [6];
  double local_2a8;
  double dStack_2a0;
  double local_298;
  Vector3_t local_288;
  Matrix3_t local_268 [4];
  undefined1 *local_148 [3];
  double local_130;
  double *local_128;
  undefined8 *local_118;
  undefined1 local_108 [16];
  double local_f8;
  double dStack_f0;
  double local_e8;
  double dStack_e0;
  double local_d8;
  double dStack_d0;
  double local_c8;
  undefined8 local_c0;
  double local_b8;
  double local_b0;
  double dStack_a8;
  undefined8 local_a0;
  double local_98;
  double dStack_90;
  double local_88;
  undefined8 local_80;
  SpatialRigidBodyInertia local_78;
  
  dVar1 = other_body->mMass;
  if ((dVar1 == 0.0) && (!NAN(dVar1))) {
    auVar11._8_8_ =
         -(ulong)((other_body->mInertia).super_Matrix3d.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                  array[5] != 0.0);
    auVar11._0_8_ =
         -(ulong)((other_body->mInertia).super_Matrix3d.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                  array[4] != 0.0);
    auVar12._8_8_ =
         -(ulong)((other_body->mInertia).super_Matrix3d.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                  array[7] != 0.0);
    auVar12._0_8_ =
         -(ulong)((other_body->mInertia).super_Matrix3d.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                  array[6] != 0.0);
    auVar12 = packssdw(auVar11,auVar12);
    auVar8._8_8_ = -(ulong)((other_body->mInertia).super_Matrix3d.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                            m_data.array[1] != 0.0);
    auVar8._0_8_ = -(ulong)((other_body->mInertia).super_Matrix3d.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                            m_data.array[0] != 0.0);
    auVar9._8_8_ = -(ulong)((other_body->mInertia).super_Matrix3d.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                            m_data.array[3] != 0.0);
    auVar9._0_8_ = -(ulong)((other_body->mInertia).super_Matrix3d.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                            m_data.array[2] != 0.0);
    auVar9 = packssdw(auVar8,auVar9);
    auVar9 = packssdw(auVar9,auVar12);
    if (((((((((((((((((auVar9 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                      (auVar9 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar9 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar9 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar9 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar9 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar9 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar9 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar9 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar9 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar9 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar9 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar9 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar9 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar9 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar9[0xf]) &&
       ((dVar6 = (other_body->mInertia).super_Matrix3d.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
                 [8], dVar6 == 0.0 && (!NAN(dVar6))))) {
      return;
    }
  }
  dVar6 = this->mMass - dVar1;
  if ((dVar6 == 0.0) && (!NAN(dVar6))) {
    this_00 = (RBDLError *)__cxa_allocate_exception(0x28);
    local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_348,"Error: cannot separate bodies as both have zero mass!\n","");
    Errors::RBDLError::RBDLError(this_00,&local_348);
    __cxa_throw(this_00,&Errors::RBDLError::typeinfo,Errors::RBDLError::~RBDLError);
  }
  local_268[0].super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
  .m_data.array[1] = (double)&other_body->mCenterOfMass;
  local_268[0].super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
  .m_data.array[2] = (double)&transform->r;
  local_268[0].super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
  .m_data.array[0] = (double)transform;
  Vector3_t::
  Vector3_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            (&local_288,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)local_268);
  dVar3 = 1.0 / dVar6;
  mass = this->mMass;
  dVar7 = (this->mCenterOfMass).super_Vector3d.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0];
  dVar10 = (this->mCenterOfMass).super_Vector3d.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
  dVar2 = (this->mCenterOfMass).super_Vector3d.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
  Math::SpatialRigidBodyInertia::createFromMassComInertiaC
            (&local_78,mass,&this->mCenterOfMass,&this->mInertia);
  TransformInertiaToBodyFrame(&local_328,transform,other_body);
  Math::SpatialRigidBodyInertia::toMatrix(&local_78);
  lVar5 = 0;
  do {
    uVar4 = *(undefined8 *)
             ((long)local_268[0].super_Matrix3d.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array + lVar5 * 2 + 8);
    *(undefined8 *)((long)local_2d8 + lVar5) =
         *(undefined8 *)
          ((long)local_268[0].super_Matrix3d.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
          + lVar5 * 2);
    *(undefined8 *)((long)local_2d8 + lVar5 + 8) = uVar4;
    *(undefined8 *)((long)local_2d8 + lVar5 + 0x10) =
         *(undefined8 *)
          ((long)local_268[0].super_Matrix3d.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
          + lVar5 * 2 + 0x10);
    lVar5 = lVar5 + 0x18;
  } while (lVar5 != 0x48);
  dVar7 = dVar3 * (dVar7 * mass -
                  dVar1 * local_288.super_Vector3d.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array[0]);
  dVar10 = dVar3 * (dVar10 * mass -
                   dVar1 * local_288.super_Vector3d.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                           m_data.array[1]);
  dVar3 = dVar3 * (dVar2 * mass -
                  dVar1 * local_288.super_Vector3d.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array[2]);
  local_128 = local_2d8;
  local_148[0] = local_108;
  local_108._8_4_ =
       SUB84(local_2d8[1] -
             local_328.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
             m_storage.m_data.array[1],0);
  local_108._0_8_ =
       local_2d8[0] -
       local_328.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[0];
  local_108._12_4_ =
       (int)((ulong)(local_2d8[1] -
                    local_328.super_Matrix3d.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[1]) >> 0x20);
  local_f8 = local_2d8[2] -
             local_328.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
             m_storage.m_data.array[2];
  dStack_f0 = local_2d8[3] -
              local_328.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
              m_storage.m_data.array[3];
  local_e8 = local_2d8[4] -
             local_328.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
             m_storage.m_data.array[4];
  dStack_e0 = local_2d8[5] -
              local_328.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
              m_storage.m_data.array[5];
  local_d8 = local_2a8 -
             local_328.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
             m_storage.m_data.array[6];
  dStack_d0 = dStack_2a0 -
              local_328.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
              m_storage.m_data.array[7];
  local_c8 = local_298 -
             local_328.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
             m_storage.m_data.array[8];
  dStack_2a0 = -dVar7;
  local_2d8[0] = 0.0;
  local_2d8[4] = 0.0;
  local_2d8[2] = -dVar10;
  local_2d8[3] = -dVar3;
  local_298 = 0.0;
  local_118 = &local_c0;
  local_c0 = 0;
  local_a0 = 0;
  local_80 = 0;
  local_2d8[1] = dVar3;
  local_2d8[5] = dVar7;
  local_2a8 = dVar10;
  local_130 = dVar6;
  local_b8 = dVar3;
  local_b0 = local_2d8[2];
  dStack_a8 = local_2d8[3];
  local_98 = dVar7;
  dStack_90 = dVar10;
  local_88 = dStack_2a0;
  Matrix3_t::
  Matrix3_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,0>const>>
            (local_268,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>_>_>
              *)local_148);
  this->mMass = dVar6;
  (this->mInertia).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[0] =
       local_268[0].super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[0];
  (this->mInertia).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[1] =
       local_268[0].super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[1];
  (this->mInertia).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[2] =
       local_268[0].super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[2];
  (this->mInertia).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[3] =
       local_268[0].super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[3];
  (this->mInertia).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[4] =
       local_268[0].super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[4];
  (this->mInertia).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[5] =
       local_268[0].super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[5];
  (this->mInertia).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[6] =
       local_268[0].super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[6];
  (this->mInertia).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[7] =
       local_268[0].super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[7];
  (this->mInertia).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[8] =
       local_268[0].super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[8];
  (this->mCenterOfMass).super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
  m_storage.m_data.array[0] = dVar7;
  (this->mCenterOfMass).super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
  m_storage.m_data.array[1] = dVar10;
  (this->mCenterOfMass).super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
  m_storage.m_data.array[2] = dVar3;
  this->mIsVirtual = false;
  return;
}

Assistant:

void Separate(const Math::SpatialTransform &transform, const Body &other_body)
  {
#ifndef RBDL_USE_CASADI_MATH
    // nothing to do if we join a massles body to the current.
    if (other_body.mMass == 0. && other_body.mInertia == Math::Matrix3d::Zero())
    {
      return;
    }
#endif

    Math::Scalar other_mass = other_body.mMass;
    Math::Scalar new_mass = mMass - other_mass;

#ifndef RBDL_USE_CASADI_MATH
    if (new_mass == 0.)
    {
      throw Errors::RBDLError("Error: cannot separate bodies as both have zero mass!\n");
    }
#endif

    Math::Vector3d other_com =
        transform.E.transpose() * other_body.mCenterOfMass + transform.r;
    Math::Vector3d new_com = (1 / new_mass) * (mMass * mCenterOfMass - other_mass * other_com);

    LOG << "other_com = " << std::endl << other_com.transpose() << std::endl;
    LOG << "rotation = " << std::endl << transform.E << std::endl;

    // We have to transform the inertia of other_body to current COM (before separation).
    // This is done in 4 steps:
    // 1. Transform the inertia from other origin to other COM
    // 2. Rotate the inertia that it is aligned to the frame of this body
    // 3. Transform inertia of other_body to the origin of the frame of
    // this body
    // 4. Substract the two inertias
    // 5. Transform the new inertia to the new COM

    Math::SpatialRigidBodyInertia this_rbi =
        Math::SpatialRigidBodyInertia::createFromMassComInertiaC(mMass, mCenterOfMass, mInertia);

    Math::Matrix3d inertia_other_com_rotated_this_origin =
        TransformInertiaToBodyFrame(transform, other_body);

    // 4. Substract the two inertias
    Math::Matrix3d inertia_substracted = Math::Matrix3d(this_rbi.toMatrix().block<3, 3>(0, 0)) -
                                         inertia_other_com_rotated_this_origin;
    LOG << "inertia_substracted  = " << std::endl << inertia_substracted << std::endl;

    // 5. Transform the summed inertia to the new COM
    Math::Matrix3d new_inertia =
        inertia_substracted - new_mass * Math::VectorCrossMatrix(new_com) *
                                  Math::VectorCrossMatrix(new_com).transpose();

    *this = Body (new_mass, new_com, new_inertia);
  }